

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  IResultCapture *pIVar1;
  SectionInfo *in_RDI;
  double dVar2;
  SectionInfo *in_stack_ffffffffffffffd0;
  
  if ((in_RDI[1].field_0x38 & 1) != 0) {
    pIVar1 = getResultCapture();
    in_stack_ffffffffffffffd0 = in_RDI;
    dVar2 = Timer::getElapsedSeconds((Timer *)in_RDI);
    (*pIVar1->_vptr_IResultCapture[4])
              (dVar2,pIVar1,in_stack_ffffffffffffffd0,&in_RDI[1].description);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  SectionInfo::~SectionInfo(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded )
            getResultCapture().sectionEnded( m_info, m_assertions, m_timer.getElapsedSeconds() );
    }